

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O1

void core::image::tiff_error_handler(char *param_1,char *fmt,__va_list_tag *ap)

{
  Exception *this;
  size_t sVar1;
  char local_848 [8];
  char msg [2048];
  string local_40;
  
  vsprintf(local_848,fmt,ap);
  this = (Exception *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  sVar1 = strlen(local_848);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,local_848,local_848 + sVar1);
  util::Exception::Exception(this,&local_40);
  __cxa_throw(this,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

void
tiff_error_handler (char const* /*module*/, char const* fmt, va_list ap)
{
    char msg[2048];
    ::vsprintf(msg, fmt, ap);
    throw util::Exception(msg);
}